

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef fori_load(jit_State *J,BCReg slot,IRType t,int mode)

{
  TRef TVar1;
  uint in_ECX;
  int in_EDX;
  jit_State *in_RDI;
  int conv;
  IRType in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint slot_00;
  
  slot_00 = in_stack_ffffffffffffffcc;
  if (((in_ECX & 4) == 0) && (slot_00 = in_stack_ffffffffffffffcc & 0xffffff, in_EDX == 0x13)) {
    slot_00 = CONCAT13((int)in_ECX >> 0x10 != 0,(int3)in_stack_ffffffffffffffcc) ^ 0xff000000;
  }
  TVar1 = sloadt(in_RDI,slot_00,in_stack_ffffffffffffffc8,0);
  return TVar1;
}

Assistant:

static TRef fori_load(jit_State *J, BCReg slot, IRType t, int mode)
{
  int conv = (tvisint(&J->L->base[slot]) != (t==IRT_INT)) ? IRSLOAD_CONVERT : 0;
  return sloadt(J, (int32_t)slot,
		t + (((mode & IRSLOAD_TYPECHECK) ||
		      (conv && t == IRT_INT && !(mode >> 16))) ?
		     IRT_GUARD : 0),
		mode + conv);
}